

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall
Assimp::ColladaParser::ReadInputChannel
          (ColladaParser *this,
          vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
          *poChannels)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar5;
  ColladaParser *this_00;
  char *__s;
  char *source;
  InputChannel channel;
  string semantic;
  char *local_230;
  string local_228;
  value_type local_208;
  undefined1 local_1c8 [408];
  
  paVar1 = &local_208.mAccessor.field_2;
  local_208.mAccessor._M_string_length = 0;
  local_208.mAccessor.field_2._M_local_buf[0] = '\0';
  local_208.mType = IT_Invalid;
  local_208.mResolved = (Accessor *)0x0;
  local_208.mIndex = 0;
  local_208.mOffset = 0;
  local_208.mAccessor._M_dataplus._M_p = (pointer)paVar1;
  uVar3 = GetAttribute(this,"semantic");
  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
  this_00 = (ColladaParser *)local_1c8;
  std::__cxx11::string::string
            ((string *)this_00,(char *)CONCAT44(extraout_var,iVar4),(allocator *)(local_1c8 + 0x20))
  ;
  local_208.mType = GetTypeForSemantic(this_00,(string *)local_1c8);
  GetAttribute(this,"source");
  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])();
  sVar2 = local_208.mAccessor._M_string_length;
  local_230 = (char *)CONCAT44(extraout_var_00,iVar4);
  if (*local_230 != '#') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 0x20));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1c8 + 0x20),"Unknown reference format in url \"",0x21);
    poVar5 = (ostream *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        (local_1c8 + 0x20),&local_230);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"\" in source attribute of <input> element.",0x29);
    std::__cxx11::stringbuf::str();
    ThrowException(this,&local_228);
  }
  __s = local_230 + 1;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&local_208.mAccessor,0,(char *)sVar2,(ulong)__s);
  uVar3 = TestAttribute(this,"offset");
  if (-1 < (int)uVar3) {
    iVar4 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar3);
    local_208.mOffset = (size_t)iVar4;
  }
  if ((local_208.mType & ~IT_Vertex) == IT_Texcoord) {
    uVar3 = TestAttribute(this,"set");
    if (-1 < (int)uVar3) {
      uVar3 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar3);
      if ((int)uVar3 < 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 0x20));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1c8 + 0x20),"Invalid index \"",0xf);
        std::ostream::operator<<(local_1c8 + 0x20,uVar3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1c8 + 0x20),"\" in set attribute of <input> element",0x25);
        std::__cxx11::stringbuf::str();
        ThrowException(this,&local_228);
      }
      local_208.mIndex = (size_t)uVar3;
    }
  }
  if (local_208.mType != IT_Invalid) {
    std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>::
    push_back(poChannels,&local_208);
  }
  SkipElement(this);
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.mAccessor._M_dataplus._M_p != paVar1) {
    operator_delete(local_208.mAccessor._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ColladaParser::ReadInputChannel(std::vector<InputChannel>& poChannels)
{
    InputChannel channel;

    // read semantic
    int attrSemantic = GetAttribute("semantic");
    std::string semantic = mReader->getAttributeValue(attrSemantic);
    channel.mType = GetTypeForSemantic(semantic);

    // read source
    int attrSource = GetAttribute("source");
    const char* source = mReader->getAttributeValue(attrSource);
    if (source[0] != '#')
        ThrowException(format() << "Unknown reference format in url \"" << source << "\" in source attribute of <input> element.");
    channel.mAccessor = source + 1; // skipping the leading #, hopefully the remaining text is the accessor ID only

    // read index offset, if per-index <input>
    int attrOffset = TestAttribute("offset");
    if (attrOffset > -1)
        channel.mOffset = mReader->getAttributeValueAsInt(attrOffset);

    // read set if texture coordinates
    if (channel.mType == IT_Texcoord || channel.mType == IT_Color) {
        int attrSet = TestAttribute("set");
        if (attrSet > -1) {
            attrSet = mReader->getAttributeValueAsInt(attrSet);
            if (attrSet < 0)
                ThrowException(format() << "Invalid index \"" << (attrSet) << "\" in set attribute of <input> element");

            channel.mIndex = attrSet;
        }
    }

    // store, if valid type
    if (channel.mType != IT_Invalid)
        poChannels.push_back(channel);

    // skip remaining stuff of this element, if any
    SkipElement();
}